

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

bit_reader_t * bit_reader_create(uint8_t *bytes,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bit_reader_t *pbVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pbVar4 = (bit_reader_t *)calloc(1,0x28);
  auVar3 = _DAT_00163b40;
  auVar2 = _DAT_00163b30;
  auVar1 = _DAT_00162370;
  if (bit_reader_create_reverse_table_created == '\0') {
    lVar5 = 0;
    auVar6 = _DAT_00163b20;
    do {
      auVar7 = pshufb(auVar2,auVar6 & auVar1);
      auVar8._0_2_ = auVar6._0_2_ >> 4;
      auVar8._2_2_ = auVar6._2_2_ >> 4;
      auVar8._4_2_ = auVar6._4_2_ >> 4;
      auVar8._6_2_ = auVar6._6_2_ >> 4;
      auVar8._8_2_ = auVar6._8_2_ >> 4;
      auVar8._10_2_ = auVar6._10_2_ >> 4;
      auVar8._12_2_ = auVar6._12_2_ >> 4;
      auVar8._14_2_ = auVar6._14_2_ >> 4;
      auVar8 = pshufb(auVar3,auVar8 & auVar1);
      *(undefined1 (*) [16])(reverse_table + lVar5) = auVar8 | auVar7;
      lVar5 = lVar5 + 0x10;
      auVar7[0] = auVar6[0] + '\x10';
      auVar7[1] = auVar6[1] + '\x10';
      auVar7[2] = auVar6[2] + '\x10';
      auVar7[3] = auVar6[3] + '\x10';
      auVar7[4] = auVar6[4] + '\x10';
      auVar7[5] = auVar6[5] + '\x10';
      auVar7[6] = auVar6[6] + '\x10';
      auVar7[7] = auVar6[7] + '\x10';
      auVar7[8] = auVar6[8] + '\x10';
      auVar7[9] = auVar6[9] + '\x10';
      auVar7[10] = auVar6[10] + '\x10';
      auVar7[0xb] = auVar6[0xb] + '\x10';
      auVar7[0xc] = auVar6[0xc] + '\x10';
      auVar7[0xd] = auVar6[0xd] + '\x10';
      auVar7[0xe] = auVar6[0xe] + '\x10';
      auVar7[0xf] = auVar6[0xf] + '\x10';
      auVar6 = auVar7;
    } while (lVar5 != 0x100);
    bit_reader_create_reverse_table_created = '\x01';
  }
  if (bytes != (uint8_t *)0x0) {
    pbVar4->bytes = bytes;
    pbVar4->len = len;
    pbVar4->current_byte_len = 8;
    pbVar4->current_byte = *bytes;
  }
  return pbVar4;
}

Assistant:

bit_reader_t *bit_reader_create(const uint8_t *bytes, size_t len) {
    bit_reader_t *r = calloc(1, sizeof(bit_reader_t));

    static bool reverse_table_created = false;

    if (!reverse_table_created) {
        create_reverse_table();
        reverse_table_created = true;
    }

    if (bytes) {
        bit_reader_reconfigure(r, bytes, len);
    }

    return r;
}